

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
PlayersIRCCommand::trigger
          (PlayersIRCCommand *this,IRC_Bot *source,string_view channel,string_view param_3,
          string_view param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  _List_node_base *p_Var7;
  undefined8 uVar8;
  char *pcVar9;
  size_t sVar10;
  bool bVar11;
  long *plVar12;
  ulong uVar13;
  long *plVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  string local_160;
  uint local_13c;
  string out;
  undefined8 local_118;
  _Alloc_hider local_110;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oStrings;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9,pcVar9,param_3._M_len,param_3._M_str);
  Jupiter::IRC::Client::Channel::getType();
  auVar15 = RenX::getTeamColor(GDI);
  auVar16 = RenX::getTeamColor(Nod);
  auVar17 = RenX::getTeamColor(Other);
  auVar18 = RenX::getTeamName(GDI);
  auVar19 = RenX::getTeamName(Nod);
  auVar20 = RenX::getTeamName(Other);
  RenX::getCore();
  lVar4 = RenX::Core::getServerCount();
  if (lVar4 != 0) {
    bVar11 = true;
    uVar13 = 0;
    do {
      uVar5 = RenX::getCore();
      lVar4 = RenX::Core::getServer(uVar5);
      cVar3 = RenX::Server::isLogChanType((int)lVar4);
      if (cVar3 != '\0') {
        lVar2 = *(long *)(lVar4 + 0x20);
        lVar6 = RenX::Server::getBotCount();
        if (lVar2 == lVar6) {
          Jupiter::IRC::Client::sendMessage(source,sVar10,pcVar9,0x17,"No players are in-game.");
        }
        else if (*(long *)(lVar4 + 0x20) == 0) {
          uVar8 = RenX::Server::getBotCount();
          string_printf_abi_cxx11_(&out,"ERROR: NO PLAYERS BUT BOT_COUNT = %u.",uVar8);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar10,pcVar9,out._M_string_length,out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          plVar12 = (long *)(lVar4 + 0x10);
          gStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&gStrings;
          gStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = 0;
          nStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&nStrings;
          nStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = 0;
          oStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&oStrings;
          local_b0._M_p = (pointer)0x0;
          oStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size = 0;
          plVar14 = (long *)*plVar12;
          local_c0._8_8_ = 0;
          local_c0._M_allocated_capacity = 0;
          local_13c = 0;
          local_110._M_p = (pointer)0x0;
          local_118 = 0;
          oStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               oStrings.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          nStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               nStrings.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          gStrings.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               gStrings.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          if (plVar14 != plVar12) {
            local_b0._M_p = (pointer)0x0;
            local_c0._8_8_ = 0;
            local_c0._M_allocated_capacity = 0;
            local_13c = 0;
            local_110._M_p = (pointer)0x0;
            local_118 = 0;
            do {
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&out);
              if (out._M_string_length < 0xd1) {
                if ((int)plVar14[0x21] == 0) {
                  if ((gStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)&gStrings) ||
                     (0xf0 < (long)&(gStrings.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev)->
                                    _M_next + out._M_string_length)) {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03%.*s[%.*s]: \x02%.*s\x02",auVar15._0_8_,auVar15._8_8_
                               ,auVar18._0_8_,auVar18._8_8_,out._M_string_length,
                               out._M_dataplus._M_p);
                    p_Var7 = (_List_node_base *)operator_new(0x30);
                    p_Var7[1]._M_next = p_Var7 + 2;
                    paVar1 = &local_160.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p == paVar1) {
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                      p_Var7[2]._M_prev = (_List_node_base *)local_160.field_2._8_8_;
                    }
                    else {
                      p_Var7[1]._M_next = (_List_node_base *)local_160._M_dataplus._M_p;
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                    }
                    p_Var7[1]._M_prev = (_List_node_base *)local_160._M_string_length;
                    local_160._M_string_length = 0;
                    local_160.field_2._M_local_buf[0] = '\0';
                    local_160._M_dataplus._M_p = (pointer)paVar1;
                    std::__detail::_List_node_base::_M_hook(p_Var7);
                    gStrings.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size =
                         gStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size + 1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != paVar1) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03, \x02%.*s\x02",out._M_string_length,
                               out._M_dataplus._M_p);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(gStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                                local_160._M_dataplus._M_p,local_160._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != &local_160.field_2) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  local_b0._M_p = (pointer)(ulong)((int)local_b0._M_p + 1);
                  local_13c = local_13c + *(byte *)(plVar14 + 0x22);
                }
                else if ((int)plVar14[0x21] == 1) {
                  if ((nStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)&nStrings) ||
                     (0xf0 < (long)&(nStrings.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev)->
                                    _M_next + out._M_string_length)) {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03%.*s[%.*s]: \x02%.*s\x02",auVar16._0_8_,auVar16._8_8_
                               ,auVar19._0_8_,auVar19._8_8_,out._M_string_length,
                               out._M_dataplus._M_p);
                    p_Var7 = (_List_node_base *)operator_new(0x30);
                    p_Var7[1]._M_next = p_Var7 + 2;
                    paVar1 = &local_160.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p == paVar1) {
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                      p_Var7[2]._M_prev = (_List_node_base *)local_160.field_2._8_8_;
                    }
                    else {
                      p_Var7[1]._M_next = (_List_node_base *)local_160._M_dataplus._M_p;
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                    }
                    p_Var7[1]._M_prev = (_List_node_base *)local_160._M_string_length;
                    local_160._M_string_length = 0;
                    local_160.field_2._M_local_buf[0] = '\0';
                    local_160._M_dataplus._M_p = (pointer)paVar1;
                    std::__detail::_List_node_base::_M_hook(p_Var7);
                    nStrings.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size =
                         nStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size + 1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != paVar1) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03, \x02%.*s\x02",out._M_string_length,
                               out._M_dataplus._M_p);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(nStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                                local_160._M_dataplus._M_p,local_160._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != &local_160.field_2) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  local_c0._8_8_ = ZEXT48((int)local_c0._8_8_ + 1);
                  local_110._M_p =
                       (pointer)(ulong)((int)local_110._M_p + (uint)*(byte *)(plVar14 + 0x22));
                }
                else {
                  if ((oStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next ==
                       (_List_node_base *)&oStrings) ||
                     (0xf0 < (long)&(oStrings.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev)->
                                    _M_next + out._M_string_length)) {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03%.*s[%.*s]: \x02%.*s\x02",auVar17._0_8_,auVar17._8_8_
                               ,auVar20._0_8_,auVar20._8_8_,out._M_string_length,
                               out._M_dataplus._M_p);
                    p_Var7 = (_List_node_base *)operator_new(0x30);
                    p_Var7[1]._M_next = p_Var7 + 2;
                    paVar1 = &local_160.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p == paVar1) {
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                      p_Var7[2]._M_prev = (_List_node_base *)local_160.field_2._8_8_;
                    }
                    else {
                      p_Var7[1]._M_next = (_List_node_base *)local_160._M_dataplus._M_p;
                      p_Var7[2]._M_next =
                           (_List_node_base *)
                           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                    local_160.field_2._M_local_buf[0]);
                    }
                    p_Var7[1]._M_prev = (_List_node_base *)local_160._M_string_length;
                    local_160._M_string_length = 0;
                    local_160.field_2._M_local_buf[0] = '\0';
                    local_160._M_dataplus._M_p = (pointer)paVar1;
                    std::__detail::_List_node_base::_M_hook(p_Var7);
                    oStrings.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size =
                         oStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size + 1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != paVar1) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  else {
                    string_printf_abi_cxx11_
                              (&local_160,"\x03, \x02%.*s\x02",out._M_string_length,
                               out._M_dataplus._M_p);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(oStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                                local_160._M_dataplus._M_p,local_160._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != &local_160.field_2) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                  }
                  local_c0._M_allocated_capacity =
                       (size_type)((int)local_c0._M_allocated_capacity + 1);
                  local_118 = ZEXT48((int)local_118 + (uint)*(byte *)(plVar14 + 0x22));
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != &out.field_2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              plVar14 = (long *)*plVar14;
            } while (plVar14 != plVar12);
            while (gStrings.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size != 0) {
              Jupiter::IRC::Client::sendMessage
                        (source,sVar10,pcVar9,
                         gStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                         gStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase(&gStrings,
                         (iterator)
                         gStrings.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next);
            }
          }
          paVar1 = &local_160.field_2;
          while (nStrings.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size != 0) {
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,
                       nStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                       nStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase(&nStrings,
                       (iterator)
                       nStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next);
          }
          while (oStrings.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size != 0) {
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,
                       oStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                       oStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase(&oStrings,
                       (iterator)
                       oStrings.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next);
          }
          string_printf_abi_cxx11_(&out,"\x0303Total Players\x03: %u",*(undefined8 *)(lVar4 + 0x20))
          ;
          if ((int)local_110._M_p + (int)local_118 + local_13c != 0) {
            string_printf_abi_cxx11_(&local_160," (%u bots)");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((int)local_b0._M_p != 0) {
            string_printf_abi_cxx11_
                      (&local_160,"\x0302 | \x03%.*s%.*s\x03: %u",auVar15._0_8_,auVar15._8_8_,
                       auVar18._0_8_,auVar18._8_8_,local_b0._M_p);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
            if (local_13c != 0) {
              string_printf_abi_cxx11_(&local_160," (%u bots)",(ulong)local_13c);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                         local_160.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          if ((int)local_c0._8_8_ != 0) {
            string_printf_abi_cxx11_
                      (&local_160,"\x0302 | \x03%.*s%.*s\x03: %u",auVar16._0_8_,auVar16._8_8_,
                       auVar19._0_8_,auVar19._8_8_,local_c0._8_8_);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
            if ((int)local_110._M_p != 0) {
              string_printf_abi_cxx11_(&local_160," (%u bots)",local_110._M_p);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                         local_160.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          if ((int)local_c0._M_allocated_capacity != 0) {
            string_printf_abi_cxx11_
                      (&local_160,"\x0302 | \x03%.*s%.*s\x03: %u",auVar17._0_8_,auVar17._8_8_,
                       auVar20._0_8_,auVar20._8_8_,local_c0._M_allocated_capacity);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                       local_160.field_2._M_local_buf[0]) + 1);
            }
            if ((int)local_118 != 0) {
              string_printf_abi_cxx11_(&local_160," (%u bots)",local_118);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&out,local_160._M_dataplus._M_p,local_160._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                         local_160.field_2._M_local_buf[0]) + 1);
              }
            }
          }
          Jupiter::IRC::Client::sendMessage
                    (source,sVar10,pcVar9,out._M_string_length,out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&oStrings.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&nStrings.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&gStrings.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
        }
        bVar11 = false;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      RenX::getCore();
      uVar5 = RenX::Core::getServerCount();
    } while (uVar5 != uVar13);
    if (!bVar11) {
      return;
    }
  }
  Jupiter::IRC::Client::sendMessage
            (source,sVar10,pcVar9,0x40,
             "Error: Channel not attached to any connected Renegade X servers.");
  return;
}

Assistant:

void PlayersIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view , std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				if (server->players.size() == 0)
				{
					source->sendMessage(channel, string_printf("ERROR: NO PLAYERS BUT BOT_COUNT = %u.", server->getBotCount()));
					continue;
				}

				// End string containers
				std::list<std::string> gStrings;
				std::list<std::string> nStrings;
				std::list<std::string> oStrings;

				// Team player counters
				unsigned int gTotal = 0;
				unsigned int nTotal = 0;
				unsigned int oTotal = 0;

				// Bot counters
				unsigned int gBots = 0;
				unsigned int nBots = 0;
				unsigned int oBots = 0;

				for (auto node = server->players.begin(); node != server->players.end(); ++node) {
					std::string name = RenX::getFormattedPlayerName(*node);
					if (name.size() > STRING_LENGTH - 32) continue; // Name will be too long to send.

					switch (node->team) {
					case RenX::TeamType::Nod:
						if (nStrings.empty() || nStrings.back().size() + name.size() > STRING_LENGTH) {
							nStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								nTeamColor.size(), nTeamColor.data(),
								nTeam.size(), nTeam.data(),
								name.size(), name.data()));
						}
						else {
							nStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++nTotal;
						if (node->isBot) {
							++nBots;
						}
						break;
					case RenX::TeamType::GDI:
						if (gStrings.empty() || gStrings.back().size() + name.size() > STRING_LENGTH)
						{
							gStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								gTeamColor.size(), gTeamColor.data(),
								gTeam.size(), gTeam.data(),
								name.size(), name.data()));
						}
						else {
							gStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++gTotal;
						if (node->isBot) {
							++gBots;
						}
						break;
					default:
						if (oStrings.empty() || oStrings.back().size() + name.size() > STRING_LENGTH) {
							oStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								oTeamColor.size(), oTeamColor.data(),
								oTeam.size(), oTeam.data(),
								name.size(), name.data()));
						}
						else {
							oStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++oTotal;
						if (node->isBot) {
							++oBots;
						}
						break;
					}
				}
				while (gStrings.size() != 0) {
					source->sendMessage(channel, gStrings.front());
					gStrings.pop_front();
				}
				while (nStrings.size() != 0) {
					source->sendMessage(channel, nStrings.front());
					nStrings.pop_front();
				}
				while (oStrings.size() != 0) {
					source->sendMessage(channel, oStrings.front());
					oStrings.pop_front();
				}

				std::string out = string_printf(IRCCOLOR "03Total Players" IRCCOLOR ": %u", server->players.size());
				if (gBots + nBots + oBots > 0) {
					out += string_printf(" (%u bots)", gBots + nBots + oBots);
				}
				if (gTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", gTeamColor.size(),
						gTeamColor.data(), gTeam.size(),
						gTeam.data(), gTotal);
					if (gBots > 0)
						out += string_printf(" (%u bots)", gBots);
				}
				if (nTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", nTeamColor.size(),
						nTeamColor.data(), nTeam.size(),
						nTeam.data(), nTotal);
					if (nBots > 0)
						out += string_printf(" (%u bots)", nBots);
				}
				if (oTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", oTeamColor.size(),
						oTeamColor.data(), oTeam.size(),
						oTeam.data(), oTotal);
					if (oBots > 0)
						out += string_printf(" (%u bots)", oBots);
				}
				source->sendMessage(channel, out);
			}
			else
				source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}